

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_adjoin_maxtrix.h
# Opt level: O0

int __thiscall adjMaxtrix<char>::GetNextVex(adjMaxtrix<char> *this,int v1,int v2)

{
  size_type sVar1;
  int local_24;
  int col;
  int v2_local;
  int v1_local;
  adjMaxtrix<char> *this_local;
  
  if ((((-1 < v1) &&
       (sVar1 = std::vector<char,_std::allocator<char>_>::size(&this->vexs), (ulong)(long)v1 < sVar1
       )) && (-1 < v2)) &&
     (sVar1 = std::vector<char,_std::allocator<char>_>::size(&this->vexs), (ulong)(long)v2 < sVar1))
  {
    local_24 = v2 + 1;
    while( true ) {
      sVar1 = std::vector<char,_std::allocator<char>_>::size(&this->vexs);
      if (sVar1 <= (ulong)(long)local_24) {
        return -1;
      }
      if (this->edge[v1][local_24] != this->MAX_WEIGHT) break;
      local_24 = local_24 + 1;
    }
    return local_24;
  }
  std::operator<<((ostream *)&std::cout,anon_var_dwarf_296f);
  return -1;
}

Assistant:

int adjMaxtrix<dataType>::GetNextVex(int v1, int v2) {
	int col;
	if (v1 < 0 || v1 >= vexs.size() || v2 < 0 || v2 >= vexs.size()) {
		cout << "参数v1或v2越界";
		return -1;
	}
	//查找v顶点的，也就是第v行的第一个有效顶点，放回其列col
	for (col = v2 + 1; col < vexs.size(); col++) {
		if (edge[v1][col] != MAX_WEIGHT)
			return col;
	}
	return -1;
}